

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.c
# Opt level: O2

int sais_main(void *T,int *SA,int *LCP,int fs,int n,int k,int cs,int isbwt,int level0)

{
  size_t sVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int *C;
  int *B;
  ulong uVar6;
  int *piVar7;
  uint *puVar8;
  int *piVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  char *__function;
  int iVar14;
  long lVar15;
  void *pvVar16;
  int iVar17;
  ulong uVar18;
  byte bVar19;
  int iVar20;
  long lVar21;
  void *pvVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  char *__assertion;
  uint uVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  undefined4 uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  ulong local_d0;
  ulong local_b8;
  int local_80;
  int t;
  void *local_58;
  ulong local_50;
  void *local_48;
  ulong local_40;
  size_t local_38;
  
  if (T == (void *)0x0) {
    __assert_fail("(T != NULL) && (SA != NULL)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                  ,0x236,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
  }
  if (((fs < 0) || (n < 1)) || (uVar36 = (ulong)(uint)k, k < 1)) {
    __assert_fail("(0 <= fs) && (0 < n) && (1 <= k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                  ,0x237,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
  }
  if ((uint)k < 0x101) {
    C = (int *)malloc((ulong)(uint)(k * 4));
    if (C == (int *)0x0) {
      return -2;
    }
    if ((uint)k <= (uint)fs) {
      bVar19 = 1;
      bVar38 = false;
      B = SA + ((n + fs) - k);
      goto LAB_0010fd1f;
    }
    B = (int *)malloc((ulong)(uint)(k * 4));
    if (B == (int *)0x0) {
      free(C);
      return -2;
    }
    bVar19 = 3;
LAB_0010fc82:
    bVar38 = false;
  }
  else {
    if ((uint)fs < (uint)k) {
      B = (int *)malloc(uVar36 * 4);
      if (B == (int *)0x0) {
        return -2;
      }
      bVar19 = 0xc;
      C = B;
      goto LAB_0010fc82;
    }
    C = SA + ((n + fs) - k);
    if (fs - k < k) {
      if ((uint)k < 0x401) {
        B = (int *)malloc((ulong)(uint)(k * 4));
        if (B == (int *)0x0) {
          return -2;
        }
        bVar19 = 2;
        goto LAB_0010fc82;
      }
      bVar19 = 8;
      bVar38 = false;
      B = C;
    }
    else {
      B = C + -uVar36;
      bVar19 = 0;
      bVar38 = true;
    }
  }
LAB_0010fd1f:
  if (((uint)n < 0x40000000) && (1 < (uint)n / (uint)k)) {
    if ((bVar19 & 1) == 0) {
      if (bVar38) {
        bVar19 = (k * 2 <= fs + k * -2) << 5;
      }
    }
    else {
      bVar19 = bVar19 + (k * 2 <= fs - k) * '\x10' + 0x10;
    }
  }
  getCounts(T,C,n,k,cs);
  getBuckets(C,B,k,1);
  uVar11 = (ulong)(uint)n;
  for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
    SA[uVar6] = 0;
  }
  uVar27 = n - 1;
  uVar18 = (ulong)uVar27;
  uVar12 = uVar18;
  uVar6 = uVar18;
  if (cs == 4) {
    uVar30 = *(uint *)((long)T + uVar18 * 4);
  }
  else {
    uVar30 = (uint)*(byte *)((long)T + uVar18);
  }
  do {
    if ((int)uVar12 < 1) {
      uVar12 = 0xffffffff;
      uVar4 = uVar30;
      break;
    }
    uVar25 = uVar6 - 1 & 0xffffffff;
    if (cs == 4) {
      uVar4 = *(uint *)((long)T + uVar25 * 4);
    }
    else {
      uVar4 = (uint)*(byte *)((long)T + uVar25);
    }
    uVar12 = (ulong)((int)uVar12 - 1);
    bVar38 = (int)uVar30 <= (int)uVar4;
    uVar30 = uVar4;
    uVar6 = uVar6 - 1;
  } while (bVar38);
  piVar9 = &t;
  local_b8 = 0;
  uVar6 = (ulong)(uint)n;
LAB_0010fe32:
  uVar30 = (uint)uVar12;
  if (-1 < (int)uVar30) {
    do {
      uVar28 = uVar4;
      uVar30 = uVar30 - 1;
      uVar25 = uVar12 - 1;
      if (uVar12 == 0) {
        uVar12 = 0xffffffff;
        uVar4 = uVar28;
        goto LAB_0010fe32;
      }
      uVar33 = (ulong)uVar30;
      if (cs == 4) {
        uVar4 = *(uint *)((long)T + uVar25 * 4);
      }
      else {
        uVar4 = (uint)*(byte *)((long)T + (uVar12 - 1));
      }
      uVar12 = uVar25;
    } while ((int)uVar4 <= (int)uVar28);
    *piVar9 = (int)uVar6;
    iVar20 = B[(int)uVar28];
    B[(int)uVar28] = iVar20 + -1;
    piVar9 = SA + (long)iVar20 + -1;
    local_b8 = local_b8 + 1;
    uVar6 = (ulong)uVar30;
    do {
      uVar6 = uVar6 - 1;
      if ((int)uVar33 < 1) {
        uVar12 = 0xffffffff;
        uVar6 = uVar25 & 0xffffffff;
        goto LAB_0010fe32;
      }
      if (cs == 4) {
        uVar30 = *(uint *)((long)T + (uVar6 & 0xffffffff) * 4);
      }
      else {
        uVar30 = (uint)*(byte *)((long)T + (uVar6 & 0xffffffff));
      }
      uVar33 = (ulong)((int)uVar33 - 1);
      bVar38 = (int)uVar4 <= (int)uVar30;
      uVar4 = uVar30;
    } while (bVar38);
    uVar6 = uVar25 & 0xffffffff;
    uVar12 = uVar33;
    goto LAB_0010fe32;
  }
  uVar30 = (uint)local_b8;
  uVar12 = local_b8 & 0xffffffff;
  if (uVar30 < 2) {
    iVar20 = 0;
    if (uVar30 != 1) goto LAB_0011085c;
    *piVar9 = (int)uVar6 + 1;
    if (level0 != 0) {
      *(undefined4 *)((long)LCP + ((long)piVar9 - (long)SA)) = 0xffffffff;
      iVar20 = 1;
      goto LAB_0011085c;
    }
  }
  else {
    if ((bVar19 & 0x30) == 0) {
      if (C == B) {
        getCounts(T,C,n,k,cs);
      }
      getBuckets(C,B,k,0);
      if (cs == 4) {
        uVar4 = *(uint *)((long)T + uVar18 * 4);
        uVar6 = (ulong)(int)uVar4;
        uVar28 = *(uint *)((long)T + (long)n * 4 + -8);
      }
      else {
        uVar6 = (ulong)*(byte *)((long)T + uVar18);
        uVar28 = (uint)*(byte *)((long)T + (long)n + -2);
        uVar4 = (uint)*(byte *)((long)T + uVar18);
      }
      iVar20 = 1 - n;
      if ((int)uVar4 <= (int)uVar28) {
        iVar20 = n + -2;
      }
      iVar5 = B[uVar6] + 1;
      SA[B[uVar6]] = iVar20;
      for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
        uVar28 = SA[uVar6];
        lVar15 = (long)(int)uVar28;
        if (0 < lVar15) {
          if (cs == 4) {
            uVar23 = *(uint *)((long)T + lVar15 * 4);
            if (*(int *)((long)T + lVar15 * 4 + 4) <= (int)uVar23) {
LAB_001104e9:
              if (uVar23 != uVar4) {
                B[(int)uVar4] = iVar5;
                iVar5 = B[(int)uVar23];
                uVar4 = uVar23;
              }
              if ((long)uVar6 < (long)iVar5) {
                uVar23 = uVar28 - 1;
                if (cs == 4) {
                  uVar31 = *(uint *)((long)T + (ulong)uVar23 * 4);
                }
                else {
                  uVar31 = (uint)*(byte *)((long)T + (ulong)uVar23);
                }
                uVar28 = -uVar28;
                if ((int)uVar4 <= (int)uVar31) {
                  uVar28 = uVar23;
                }
                SA[iVar5] = uVar28;
                iVar5 = iVar5 + 1;
                uVar28 = 0;
                goto LAB_00110537;
              }
              __assertion = "i < bb";
              __function = "void LMSsort1(const void *, int *, int *, int *, int, int, int)";
              uVar27 = 0x5d;
              goto LAB_001120b1;
            }
          }
          else {
            uVar23 = (uint)*(byte *)((long)T + lVar15);
            if (*(byte *)((long)T + lVar15 + 1) <= *(byte *)((long)T + lVar15)) goto LAB_001104e9;
          }
          __assertion = "chr(j) >= chr(j + 1)";
          __function = "void LMSsort1(const void *, int *, int *, int *, int, int, int)";
          uVar27 = 0x5b;
          goto LAB_001120b1;
        }
        if ((int)uVar28 < 0) {
          uVar28 = ~uVar28;
LAB_00110537:
          SA[uVar6] = uVar28;
        }
      }
      if (C == B) {
        getCounts(T,C,n,k,cs);
      }
      getBuckets(C,B,k,1);
      iVar20 = *B;
      uVar4 = 0;
      uVar6 = uVar18;
      while (iVar5 = (int)uVar6, -1 < iVar5) {
        uVar28 = SA[uVar6];
        lVar15 = (long)(int)uVar28;
        if (0 < lVar15) {
          if (cs == 4) {
            uVar23 = *(uint *)((long)T + lVar15 * 4);
            if ((int)uVar23 <= *(int *)((long)T + lVar15 * 4 + 4)) {
LAB_001105c1:
              if (uVar23 != uVar4) {
                B[(int)uVar4] = iVar20;
                iVar20 = B[(int)uVar23];
                uVar4 = uVar23;
              }
              if (iVar20 <= iVar5) {
                uVar23 = uVar28 - 1;
                if (cs == 4) {
                  uVar31 = *(uint *)((long)T + (ulong)uVar23 * 4);
                }
                else {
                  uVar31 = (uint)*(byte *)((long)T + (ulong)uVar23);
                }
                uVar28 = ~uVar28;
                if ((int)uVar31 <= (int)uVar4) {
                  uVar28 = uVar23;
                }
                lVar15 = (long)iVar20;
                iVar20 = iVar20 + -1;
                SA[lVar15 + -1] = uVar28;
                SA[uVar6] = 0;
                goto LAB_00110616;
              }
              __assertion = "(bb) <= i";
              __function = "void LMSsort1(const void *, int *, int *, int *, int, int, int)";
              uVar27 = 0x6d;
              goto LAB_001120b1;
            }
          }
          else {
            uVar23 = (uint)*(byte *)((long)T + lVar15);
            if (*(byte *)((long)T + lVar15) <= *(byte *)((long)T + lVar15 + 1)) goto LAB_001105c1;
          }
          __assertion = "chr(j) <= chr(j + 1)";
          __function = "void LMSsort1(const void *, int *, int *, int *, int, int, int)";
          uVar27 = 0x6b;
          goto LAB_001120b1;
        }
LAB_00110616:
        uVar6 = (ulong)(iVar5 - 1);
      }
      uVar6 = 0;
      while (SA[uVar6] < 0) {
        SA[uVar6] = ~SA[uVar6];
        uVar6 = uVar6 + 1;
        if (uVar11 <= uVar6) {
          __assertion = "(i + 1) < n";
          __function = "int LMSpostproc1(const void *, int *, int, int, int)";
          uVar27 = 0x7f;
LAB_001120b1:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                        ,uVar27,__function);
        }
      }
      if ((int)uVar6 < (int)uVar30) {
        uVar25 = uVar6 & 0xffffffff;
        do {
          do {
            uVar33 = uVar6 + 1;
            if (uVar11 <= uVar33) {
              __assert_fail("i < n",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x82,"int LMSpostproc1(const void *, int *, int, int, int)");
            }
            lVar15 = uVar6 + 1;
            uVar6 = uVar33;
          } while (-1 < SA[lVar15]);
          iVar20 = (int)uVar25;
          uVar4 = iVar20 + 1;
          uVar25 = (ulong)uVar4;
          SA[iVar20] = ~SA[lVar15];
          SA[uVar33] = 0;
        } while (uVar4 != uVar30);
      }
      uVar25 = uVar18;
      uVar6 = uVar18;
      if (cs == 4) {
        uVar4 = *(uint *)((long)T + uVar18 * 4);
      }
      else {
        uVar4 = (uint)*(byte *)((long)T + uVar18);
      }
      do {
        uVar33 = uVar18;
        if ((int)uVar25 < 1) {
          uVar25 = 0xffffffff;
          uVar28 = uVar4;
          break;
        }
        uVar37 = uVar6 - 1 & 0xffffffff;
        if (cs == 4) {
          uVar28 = *(uint *)((long)T + uVar37 * 4);
        }
        else {
          uVar28 = (uint)*(byte *)((long)T + uVar37);
        }
        uVar25 = (ulong)((int)uVar25 - 1);
        bVar38 = (int)uVar4 <= (int)uVar28;
        uVar4 = uVar28;
        uVar6 = uVar6 - 1;
      } while (bVar38);
LAB_001106db:
      uVar4 = (uint)uVar25;
      if (-1 < (int)uVar4) {
        do {
          uVar4 = uVar4 - 1;
          uVar6 = uVar25 - 1;
          if (uVar25 == 0) {
            uVar25 = 0xffffffff;
            goto LAB_001106db;
          }
          uVar37 = (ulong)uVar4;
          if (cs == 4) {
            uVar23 = *(uint *)((long)T + uVar6 * 4);
          }
          else {
            uVar23 = (uint)*(byte *)((long)T + (uVar25 - 1));
          }
          bVar38 = (int)uVar23 <= (int)uVar28;
          uVar25 = uVar6;
          uVar28 = uVar23;
        } while (bVar38);
        iVar20 = (int)uVar33;
        uVar28 = (int)uVar6 + 1;
        uVar33 = (ulong)uVar28;
        SA[(uVar28 >> 1) + uVar30] = iVar20 - (int)uVar6;
        uVar6 = (ulong)uVar4;
        do {
          uVar6 = uVar6 - 1;
          if ((int)uVar37 < 1) {
            uVar25 = 0xffffffff;
            uVar28 = uVar23;
            break;
          }
          if (cs == 4) {
            uVar28 = *(uint *)((long)T + (uVar6 & 0xffffffff) * 4);
          }
          else {
            uVar28 = (uint)*(byte *)((long)T + (uVar6 & 0xffffffff));
          }
          uVar37 = (ulong)((int)uVar37 - 1);
          bVar38 = (int)uVar23 <= (int)uVar28;
          uVar25 = uVar37;
          uVar23 = uVar28;
        } while (bVar38);
        goto LAB_001106db;
      }
      uVar4 = 0;
      iVar20 = 0;
      iVar5 = n;
      for (uVar6 = 0; uVar6 != uVar12; uVar6 = uVar6 + 1) {
        iVar24 = SA[uVar6];
        uVar25 = (ulong)(int)((iVar24 >> 1) + uVar30);
        uVar28 = SA[uVar25];
        if ((uVar28 == uVar4) && ((int)(uVar28 + iVar5) < n)) {
          uVar33 = 0;
          if (0 < (int)uVar4) {
            uVar33 = (ulong)uVar4;
          }
          for (uVar37 = 0; uVar33 != uVar37; uVar37 = uVar37 + 1) {
            if (cs == 4) {
              uVar23 = *(uint *)((long)T + uVar37 * 4 + (long)iVar24 * 4);
              uVar31 = *(uint *)((long)T + uVar37 * 4 + (long)iVar5 * 4);
            }
            else {
              uVar23 = (uint)*(byte *)((long)T + uVar37 + (long)iVar24);
              uVar31 = (uint)*(byte *)((long)T + uVar37 + (long)iVar5);
            }
            if (uVar23 != uVar31) {
              uVar33 = uVar37 & 0xffffffff;
              break;
            }
          }
          local_50 = uVar25;
          if ((uint)uVar33 != uVar4) goto LAB_00110842;
        }
        else {
LAB_00110842:
          iVar20 = iVar20 + 1;
          uVar4 = uVar28;
          iVar5 = iVar24;
        }
        SA[uVar25] = iVar20;
      }
    }
    else {
      if ((bVar19 & 0x10) == 0) {
        piVar9 = B + -(ulong)(uint)(k * 2);
      }
      else {
        piVar9 = (int *)malloc((ulong)(uint)(k * 2) * 4);
        if (piVar9 == (int *)0x0) {
          if ((bVar19 & 5) != 0) {
            free(C);
          }
          iVar20 = -2;
          goto joined_r0x00110b9b;
        }
      }
      if (n <= (int)(uVar6 + 1)) {
        __assert_fail("(j + 1) < n",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0x272,
                      "int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
      }
      if (cs == 4) {
        uVar4 = *(uint *)((long)T + uVar6 * 4 + 4);
      }
      else {
        uVar4 = (uint)*(byte *)((long)T + uVar6 + 1);
      }
      B[(int)uVar4] = B[(int)uVar4] + 1;
      iVar20 = 0;
      for (lVar15 = 0; uVar36 * 4 - lVar15 != 0; lVar15 = lVar15 + 4) {
        iVar20 = iVar20 + *(int *)((long)C + lVar15);
        iVar5 = *(int *)((long)B + lVar15);
        if (iVar5 != iVar20) {
          if (SA[iVar5] == 0) {
            __assert_fail("SA[B[i]] != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x276,
                          "int sais_main(const void *, int *, int *, int, int, int, int, int, int)")
            ;
          }
          SA[iVar5] = SA[iVar5] + n;
        }
        *(undefined4 *)((long)piVar9 + lVar15 + uVar36 * 4) = 0;
        *(undefined4 *)((long)piVar9 + lVar15) = 0;
      }
      if (C == B) {
        __assert_fail("C != B",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0xa9,"void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)"
                     );
      }
      getBuckets(C,B,k,0);
      if (cs == 4) {
        uVar4 = *(uint *)((long)T + uVar18 * 4);
        uVar6 = (ulong)(int)uVar4;
        uVar28 = *(uint *)((long)T + (ulong)(n - 2) * 4);
      }
      else {
        uVar6 = (ulong)*(byte *)((long)T + uVar18);
        uVar28 = (uint)*(byte *)((long)T + (ulong)(n - 2));
        uVar4 = (uint)*(byte *)((long)T + uVar18);
      }
      puVar8 = (uint *)(SA + (long)B[uVar6] + 1);
      puVar8[-1] = -(uint)((int)uVar28 < (int)uVar4) ^ n * 2 - 2U;
      iVar20 = 0;
      for (uVar6 = 0; uVar25 = uVar18, uVar11 != uVar6; uVar6 = uVar6 + 1) {
        uVar28 = SA[uVar6];
        if ((int)uVar28 < 1) {
          if ((int)uVar28 < 0) {
            uVar28 = ~uVar28;
            goto LAB_001101bf;
          }
        }
        else {
          iVar5 = 0;
          if (n <= (int)uVar28) {
            iVar5 = n;
          }
          lVar15 = (long)(int)(uVar28 - iVar5);
          if (cs == 4) {
            uVar23 = *(uint *)((long)T + lVar15 * 4);
            if ((int)uVar23 < *(int *)((long)T + lVar15 * 4 + 4)) {
LAB_00111fb4:
              __assert_fail("chr(j) >= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0xb6,
                            "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)"
                           );
            }
          }
          else {
            uVar23 = (uint)*(byte *)((long)T + lVar15);
            if (*(byte *)((long)T + lVar15) < *(byte *)((long)T + lVar15 + 1)) goto LAB_00111fb4;
          }
          if (uVar23 != uVar4) {
            B[(int)uVar4] = (int)((ulong)((long)puVar8 - (long)SA) >> 2);
            puVar8 = (uint *)(SA + B[(int)uVar23]);
            uVar4 = uVar23;
          }
          if ((long)puVar8 - (long)SA >> 2 <= (long)uVar6) {
            __assert_fail("i < (b - SA)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0xb8,
                          "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)");
          }
          uVar25 = lVar15 - 1;
          if (cs == 4) {
            uVar31 = *(uint *)((long)T + lVar15 * 4 + -4);
          }
          else {
            uVar31 = (uint)*(byte *)((long)T + uVar25);
          }
          iVar20 = iVar20 + (uint)(n <= (int)uVar28);
          uVar28 = (uint)((int)uVar31 < (int)uVar4) | uVar23 * 2;
          if (piVar9[(int)uVar28] != iVar20) {
            uVar25 = (ulong)(uint)((int)uVar25 + n);
            piVar9[(int)uVar28] = iVar20;
          }
          *puVar8 = -(uint)((int)uVar31 < (int)uVar4) ^ (uint)uVar25;
          puVar8 = puVar8 + 1;
          uVar28 = 0;
LAB_001101bf:
          SA[uVar6] = uVar28;
        }
      }
      while (uVar4 = (uint)uVar25, -1 < (int)uVar4) {
        iVar5 = SA[uVar25];
        if (iVar5 < n && 0 < iVar5) {
          piVar7 = SA + uVar25;
          *piVar7 = iVar5 + n;
          do {
            piVar13 = piVar7 + -1;
            piVar7 = piVar7 + -1;
            uVar4 = (int)uVar25 - 1;
            uVar25 = (ulong)uVar4;
          } while (*piVar13 < n);
          *piVar7 = *piVar13 - n;
        }
        uVar25 = (ulong)(uVar4 - 1);
      }
      getBuckets(C,B,k,1);
      iVar20 = iVar20 + 1;
      piVar7 = SA + *B;
      uVar4 = 0;
      for (uVar6 = uVar18; -1 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
        iVar5 = SA[uVar6];
        if (0 < iVar5) {
          iVar24 = 0;
          if (n <= iVar5) {
            iVar24 = n;
          }
          lVar15 = (long)(iVar5 - iVar24);
          if (cs == 4) {
            uVar28 = *(uint *)((long)T + lVar15 * 4);
            if (*(int *)((long)T + lVar15 * 4 + 4) < (int)uVar28) {
LAB_00111fd3:
              __assert_fail("chr(j) <= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0xd2,
                            "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)"
                           );
            }
          }
          else {
            uVar28 = (uint)*(byte *)((long)T + lVar15);
            if (*(byte *)((long)T + lVar15 + 1) < *(byte *)((long)T + lVar15)) goto LAB_00111fd3;
          }
          if (uVar28 != uVar4) {
            B[(int)uVar4] = (int)((ulong)((long)piVar7 - (long)SA) >> 2);
            piVar7 = SA + B[(int)uVar28];
            uVar4 = uVar28;
          }
          if ((long)uVar6 < (long)piVar7 - (long)SA >> 2) {
            __assert_fail("(b - SA) <= i",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0xd4,
                          "void LMSsort2(const void *, int *, int *, int *, int *, int, int, int)");
          }
          uVar25 = lVar15 - 1;
          if (cs == 4) {
            uVar23 = *(uint *)((long)T + lVar15 * 4 + -4);
          }
          else {
            uVar23 = (uint)*(byte *)((long)T + uVar25);
          }
          iVar20 = iVar20 + (uint)(n <= iVar5);
          uVar28 = (uint)((int)uVar4 < (int)uVar23) | uVar28 * 2;
          if (piVar9[(int)uVar28] != iVar20) {
            uVar25 = (ulong)(uint)((int)uVar25 + n);
            piVar9[(int)uVar28] = iVar20;
          }
          iVar5 = -2 - (int)uVar25;
          if ((int)uVar23 <= (int)uVar4) {
            iVar5 = (int)uVar25;
          }
          piVar7[-1] = iVar5;
          piVar7 = piVar7 + -1;
          SA[uVar6] = 0;
        }
      }
      uVar6 = 0;
      iVar20 = 0;
      while (SA[uVar6] < 0) {
        uVar4 = ~SA[uVar6];
        iVar20 = iVar20 + (uint)(n <= (int)uVar4);
        SA[uVar6] = uVar4;
        uVar6 = uVar6 + 1;
        if (uVar11 <= uVar6) {
          __assert_fail("(i + 1) < n",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                        ,0xe8,"int LMSpostproc2(int *, int, int)");
        }
      }
      if ((int)uVar6 < (int)uVar30) {
        uVar25 = uVar6 & 0xffffffff;
        do {
          do {
            uVar33 = uVar6 + 1;
            if (uVar11 <= uVar33) {
              __assert_fail("i < n",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0xec,"int LMSpostproc2(int *, int, int)");
            }
            lVar15 = uVar6 + 1;
            uVar6 = uVar33;
          } while (-1 < SA[lVar15]);
          uVar28 = ~SA[lVar15];
          iVar20 = iVar20 + (uint)(n <= (int)uVar28);
          iVar5 = (int)uVar25;
          uVar4 = iVar5 + 1;
          uVar25 = (ulong)uVar4;
          SA[iVar5] = uVar28;
          SA[uVar33] = 0;
        } while (uVar4 != uVar30);
      }
      if (iVar20 < (int)uVar30) {
        iVar5 = iVar20 + 1;
        uVar6 = uVar12;
        while (0 < (int)uVar6) {
          iVar24 = SA[uVar6 - 1];
          uVar6 = uVar6 - 1;
          iVar17 = 0;
          if (n <= iVar24) {
            iVar17 = n;
          }
          iVar5 = iVar5 - (uint)(n <= iVar24);
          SA[(int)((iVar24 - iVar17 >> 1) + uVar30)] = iVar5;
        }
      }
      else {
        for (uVar6 = 0; local_b8 != uVar6; uVar6 = uVar6 + 1) {
          if (n <= SA[uVar6]) {
            SA[uVar6] = SA[uVar6] - n;
          }
        }
      }
      if ((bVar19 & 0x10) != 0) {
        free(piVar9);
      }
    }
LAB_0011085c:
    if (iVar20 < (int)uVar30) {
      if ((bVar19 & 4) != 0) {
        free(C);
      }
      if ((bVar19 & 2) != 0) {
        free(B);
      }
      iVar5 = fs + n + uVar30 * -2;
      if ((bVar19 & 0xd) == 0) {
        if (iVar5 < iVar20 + k) {
          bVar19 = bVar19 | 8;
        }
        else {
          iVar5 = iVar5 - k;
        }
      }
      if ((int)(iVar5 + uVar30) < (int)((uint)n >> 1)) {
        __assert_fail("(n >> 1) <= (newfs + m)",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                      ,0x292,
                      "int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
      }
      piVar9 = SA + uVar12 + (long)iVar5;
      iVar17 = uVar30 - 1;
      lVar15 = (long)(int)(((uint)n >> 1) + uVar30);
      iVar24 = iVar17;
      while ((long)uVar12 < lVar15) {
        lVar35 = lVar15 + -1;
        lVar15 = lVar15 + -1;
        if (SA[lVar35] != 0) {
          lVar21 = (long)iVar24;
          iVar24 = iVar24 + -1;
          piVar9[lVar21] = SA[lVar35] + -1;
        }
      }
      iVar20 = sais_main(piVar9,SA,(int *)0x0,iVar5,uVar30,iVar20,4,0,0);
      if (iVar20 != 0) {
joined_r0x00110a09:
        if ((bVar19 & 1) != 0) {
          free(C);
        }
        return -2;
      }
      uVar25 = uVar18;
      uVar6 = uVar18;
      if (cs == 4) {
        uVar4 = *(uint *)((long)T + uVar18 * 4);
      }
      else {
        uVar4 = (uint)*(byte *)((long)T + uVar18);
      }
      do {
        if ((int)uVar25 < 1) {
          uVar25 = 0xffffffff;
          uVar28 = uVar4;
          break;
        }
        uVar33 = uVar6 - 1 & 0xffffffff;
        if (cs == 4) {
          uVar28 = *(uint *)((long)T + uVar33 * 4);
        }
        else {
          uVar28 = (uint)*(byte *)((long)T + uVar33);
        }
        uVar25 = (ulong)((int)uVar25 - 1);
        bVar38 = (int)uVar4 <= (int)uVar28;
        uVar4 = uVar28;
        uVar6 = uVar6 - 1;
      } while (bVar38);
LAB_00110a75:
      uVar4 = (uint)uVar25;
      if (-1 < (int)uVar4) {
        do {
          uVar4 = uVar4 - 1;
          uVar6 = uVar25 - 1;
          if (uVar25 == 0) {
            uVar25 = 0xffffffff;
            goto LAB_00110a75;
          }
          uVar33 = (ulong)uVar4;
          if (cs == 4) {
            uVar23 = *(uint *)((long)T + uVar6 * 4);
          }
          else {
            uVar23 = (uint)*(byte *)((long)T + (uVar25 - 1));
          }
          bVar38 = (int)uVar23 <= (int)uVar28;
          uVar25 = uVar6;
          uVar28 = uVar23;
        } while (bVar38);
        lVar15 = (long)iVar17;
        iVar17 = iVar17 + -1;
        piVar9[lVar15] = (int)uVar6 + 1;
        uVar6 = (ulong)uVar4;
        do {
          uVar6 = uVar6 - 1;
          if ((int)uVar33 < 1) {
            uVar25 = 0xffffffff;
            uVar28 = uVar23;
            break;
          }
          if (cs == 4) {
            uVar28 = *(uint *)((long)T + (uVar6 & 0xffffffff) * 4);
          }
          else {
            uVar28 = (uint)*(byte *)((long)T + (uVar6 & 0xffffffff));
          }
          uVar33 = (ulong)((int)uVar33 - 1);
          bVar38 = (int)uVar23 <= (int)uVar28;
          uVar25 = uVar33;
          uVar23 = uVar28;
        } while (bVar38);
        goto LAB_00110a75;
      }
      piVar7 = SA;
      if (level0 != 0) {
        piVar9[uVar12] = n;
        iVar20 = *SA;
        if (uVar30 < (uint)n / 3) {
          LCP[uVar12 + (long)(iVar20 * 2)] = uVar27;
          LCP[uVar12 + (long)(iVar20 * 2 + 1)] = 0;
          for (uVar6 = 1; uVar6 < uVar12; uVar6 = uVar6 + 1) {
            lVar15 = (long)iVar20;
            iVar20 = SA[uVar6];
            iVar5 = piVar9[lVar15];
            LCP[uVar12 + (long)(iVar20 * 2)] = iVar5;
            LCP[uVar12 + (long)(iVar20 * 2 + 1)] = piVar9[lVar15 + 1] - iVar5;
          }
          iVar20 = 0;
          uVar4 = 0;
          pvVar16 = T;
          pvVar22 = T;
          for (uVar6 = 0; uVar6 != uVar11; uVar6 = uVar6 + 1) {
            if (uVar6 == (uint)piVar9[iVar20]) {
              uVar28 = iVar20 * 2;
              if ((int)uVar4 < 1) {
                uVar4 = 0;
              }
              uVar25 = (ulong)uVar4;
              do {
                iVar5 = (int)uVar25;
                if (cs == 4) {
                  uVar4 = *(uint *)((long)pvVar22 + uVar25 * 4);
                  uVar23 = *(uint *)((long)T + (long)(LCP[uVar12 + (long)(int)uVar28] + iVar5) * 4);
                }
                else {
                  uVar4 = (uint)*(byte *)((long)pvVar16 + uVar25);
                  uVar23 = (uint)*(byte *)((long)T + (long)(LCP[uVar12 + (long)(int)uVar28] + iVar5)
                                          );
                }
                uVar25 = uVar25 + 1;
              } while (uVar4 == uVar23);
              t = LCP[uVar12 + (long)(int)(uVar28 | 1)];
              uVar4 = piVar9[(long)iVar20 + 1] - piVar9[iVar20];
              if ((int)uVar4 < t) {
                uVar4 = t;
              }
              LCP[uVar12 + (long)(int)uVar28] = iVar5;
              uVar4 = ~uVar4 + (int)uVar25;
              iVar20 = iVar20 + 1;
            }
            pvVar22 = (void *)((long)pvVar22 + 4);
            pvVar16 = (void *)((long)pvVar16 + 1);
          }
          for (uVar6 = 0; local_b8 != uVar6; uVar6 = uVar6 + 1) {
            LCP[uVar6] = LCP[uVar12 + (long)(SA[uVar6] * 2)];
          }
        }
        else {
          LCP[iVar20] = uVar27;
          LCP[uVar12 + (long)iVar20] = 0;
          for (uVar6 = 1; uVar6 < uVar12; uVar6 = uVar6 + 1) {
            lVar15 = (long)iVar20;
            iVar20 = SA[uVar6];
            iVar5 = piVar9[lVar15];
            LCP[iVar20] = iVar5;
            LCP[uVar12 + (long)iVar20] = piVar9[lVar15 + 1] - iVar5;
          }
          iVar20 = 0;
          uVar4 = 0;
          pvVar16 = T;
          pvVar22 = T;
          for (uVar6 = 0; uVar6 != uVar11; uVar6 = uVar6 + 1) {
            if (uVar6 == (uint)piVar9[iVar20]) {
              uVar25 = (ulong)uVar4;
              if ((int)uVar4 < 1) {
                uVar25 = 0;
              }
              do {
                iVar5 = (int)uVar25;
                if (cs == 4) {
                  uVar4 = *(uint *)((long)pvVar22 + uVar25 * 4);
                  uVar28 = *(uint *)((long)T + (long)(LCP[iVar20] + iVar5) * 4);
                }
                else {
                  uVar4 = (uint)*(byte *)((long)pvVar16 + uVar25);
                  uVar28 = (uint)*(byte *)((long)T + (long)(LCP[iVar20] + iVar5));
                }
                uVar25 = uVar25 + 1;
              } while (uVar4 == uVar28);
              t = LCP[uVar12 + (long)iVar20];
              uVar4 = piVar9[(long)iVar20 + 1] - piVar9[iVar20];
              if ((int)uVar4 < t) {
                uVar4 = t;
              }
              LCP[uVar12 + (long)iVar20] = iVar5;
              uVar4 = ~uVar4 + (int)uVar25;
              iVar20 = iVar20 + 1;
            }
            pvVar22 = (void *)((long)pvVar22 + 4);
            pvVar16 = (void *)((long)pvVar16 + 1);
          }
          for (uVar6 = 0; local_b8 != uVar6; uVar6 = uVar6 + 1) {
            LCP[uVar6] = LCP[uVar12 + (long)SA[uVar6]];
          }
        }
      }
      while (bVar38 = local_b8 != 0, local_b8 = local_b8 - 1, bVar38) {
        *piVar7 = piVar9[*piVar7];
        piVar7 = piVar7 + 1;
      }
      if (((bVar19 & 4) != 0) && (B = (int *)malloc(uVar36 * 4), C = B, B == (int *)0x0)) {
        return -2;
      }
      if (((bVar19 & 2) != 0) && (B = (int *)malloc(uVar36 * 4), B == (int *)0x0))
      goto joined_r0x00110a09;
    }
    else if (level0 != 0) {
      piVar9 = SA;
      for (uVar6 = 1; uVar6 < uVar12; uVar6 = uVar6 + 1) {
        iVar20 = *piVar9;
        piVar9 = SA + uVar6;
        lVar15 = 0;
        do {
          if (cs == 4) {
            uVar4 = *(uint *)((long)T + lVar15 * 4 + (long)*piVar9 * 4);
            uVar28 = *(uint *)((long)T + lVar15 * 4 + (long)iVar20 * 4);
          }
          else {
            uVar4 = (uint)*(byte *)((long)T + lVar15 + *piVar9);
            uVar28 = (uint)*(byte *)((long)T + lVar15 + iVar20);
          }
          lVar15 = lVar15 + 1;
        } while (uVar4 == uVar28);
        LCP[uVar6] = (int)lVar15 + -1;
      }
    }
  }
  if ((bVar19 & 8) != 0) {
    getCounts(T,C,n,k,cs);
  }
  if (1 < uVar30) {
    getBuckets(C,B,k,1);
    uVar6 = (ulong)(uVar30 - 1);
    iVar20 = SA[uVar6];
    if (cs == 4) {
      uVar30 = *(uint *)((long)T + (long)iVar20 * 4);
    }
    else {
      uVar30 = (uint)*(byte *)((long)T + (long)iVar20);
    }
    uVar4 = n;
    if (level0 == 0) {
LAB_00110f9b:
      uVar23 = uVar30;
      uVar30 = B[(int)uVar23];
      lVar15 = (long)(int)uVar4;
      uVar28 = uVar30;
      if (lVar15 < (int)uVar30) {
        uVar28 = uVar4;
      }
      piVar9 = SA + lVar15 + -1;
      for (; uVar12 = uVar6, (int)uVar30 < lVar15; lVar15 = lVar15 + -1) {
        SA[lVar15 + -1] = 0;
        uVar4 = uVar4 - 1;
        piVar9 = piVar9 + -1;
      }
LAB_00110fda:
      uVar28 = uVar28 - 1;
      *piVar9 = iVar20;
      if (0 < (int)uVar6) goto code_r0x00110fe1;
      for (uVar6 = (ulong)uVar28; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
        SA[uVar6 - 1] = 0;
      }
      goto LAB_00111028;
    }
    iVar5 = LCP[uVar6];
LAB_00110ed8:
    uVar28 = B[(int)uVar30];
    lVar35 = (long)(int)uVar4;
    lVar15 = lVar35;
    uVar23 = uVar28;
    if (lVar35 < (int)uVar28) {
      uVar23 = uVar4;
    }
    for (; lVar21 = lVar15 + -1, uVar12 = uVar6, (int)uVar28 < lVar35; lVar35 = lVar35 + -1) {
      SA[lVar35 + -1] = 0;
      LCP[lVar35 + -1] = -2;
      uVar4 = uVar4 - 1;
      lVar15 = lVar15 + -1;
    }
LAB_00110f16:
    lVar15 = lVar21;
    uVar23 = uVar23 - 1;
    SA[lVar15] = iVar20;
    LCP[lVar15] = iVar5;
    if (0 < (int)uVar6) goto code_r0x00110f23;
    LCP[lVar15] = -1;
    for (uVar6 = (ulong)uVar23; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      SA[uVar6 - 1] = 0;
      LCP[uVar6 - 1] = -2;
    }
  }
LAB_00111028:
  if (isbwt == 0) {
    if (level0 == 0) {
      if (C == B) {
        getCounts(T,C,n,k,cs);
      }
      getBuckets(C,B,k,0);
      uVar30 = uVar27;
      if (cs == 4) {
        uVar36 = (ulong)*(int *)((long)T + uVar18 * 4);
        iVar20 = B[uVar36];
        if (1 < n) {
          uVar4 = *(uint *)((long)T + uVar11 * 4 + -8);
LAB_00111d26:
          uVar30 = -n;
          if ((int)uVar36 <= (int)uVar4) {
            uVar30 = uVar27;
          }
        }
      }
      else {
        uVar36 = (ulong)*(byte *)((long)T + uVar18);
        iVar20 = B[uVar36];
        if (1 < n) {
          uVar4 = (uint)*(byte *)((long)T + (uVar11 - 2));
          goto LAB_00111d26;
        }
      }
      iVar5 = iVar20 + 1;
      SA[iVar20] = uVar30;
      for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
        uVar27 = SA[uVar6];
        lVar15 = (long)(int)uVar27;
        SA[uVar6] = ~uVar27;
        if (0 < lVar15) {
          uVar30 = uVar27 - 1;
          if (cs == 4) {
            uVar4 = *(uint *)((long)T + (ulong)uVar30 * 4);
            if ((int)uVar4 < *(int *)((long)T + lVar15 * 4)) {
LAB_001121ed:
              __assert_fail("chr(j) >= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x116,"void induceSA(const void *, int *, int *, int *, int, int, int)"
                           );
            }
          }
          else {
            bVar2 = *(byte *)((long)T + (ulong)uVar30);
            uVar4 = (uint)bVar2;
            if (bVar2 < *(byte *)((long)T + lVar15)) goto LAB_001121ed;
          }
          uVar28 = (uint)uVar36;
          if (uVar4 != uVar28) {
            B[(int)uVar28] = iVar5;
            iVar5 = B[(int)uVar4];
            uVar28 = uVar4;
          }
          if ((long)iVar5 <= (long)uVar6) {
            __assert_fail("i < bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x118,"void induceSA(const void *, int *, int *, int *, int, int, int)");
          }
          uVar4 = 0;
          if (uVar27 != 1) {
            if (cs == 4) {
              uVar23 = *(uint *)((long)T + lVar15 * 4 + -8);
            }
            else {
              uVar23 = (uint)*(byte *)((long)T + lVar15 + -2);
            }
            uVar4 = -uVar27;
            if ((int)uVar28 <= (int)uVar23) {
              uVar4 = uVar30;
            }
          }
          SA[iVar5] = uVar4;
          iVar5 = iVar5 + 1;
          uVar36 = (ulong)uVar28;
        }
      }
      if (C == B) {
        getCounts(T,C,n,k,cs);
      }
      getBuckets(C,B,k,1);
      iVar5 = *B;
      iVar20 = 0;
      uVar27 = 0;
      while (iVar24 = (int)uVar18, -1 < iVar24) {
        uVar30 = SA[uVar18];
        lVar15 = (long)(int)uVar30;
        if (lVar15 < 1) {
          SA[uVar18] = ~uVar30;
        }
        else {
          uVar4 = uVar30 - 1;
          if (cs == 4) {
            uVar28 = *(uint *)((long)T + (ulong)uVar4 * 4);
            if (*(int *)((long)T + lVar15 * 4) < (int)uVar28) {
LAB_0011220c:
              __assert_fail("chr(j) <= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x123,"void induceSA(const void *, int *, int *, int *, int, int, int)"
                           );
            }
          }
          else {
            bVar2 = *(byte *)((long)T + (ulong)uVar4);
            uVar28 = (uint)bVar2;
            if (*(byte *)((long)T + lVar15) < bVar2) goto LAB_0011220c;
          }
          if (uVar28 != uVar27) {
            B[(int)uVar27] = iVar5;
            iVar5 = B[(int)uVar28];
            uVar27 = uVar28;
          }
          if (iVar24 < iVar5) {
            __assert_fail("bb <= i",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x125,"void induceSA(const void *, int *, int *, int *, int, int, int)");
          }
          if (uVar4 == 0) {
LAB_00111ea9:
            uVar4 = -uVar30;
          }
          else {
            if (cs == 4) {
              uVar28 = *(uint *)((long)T + lVar15 * 4 + -8);
            }
            else {
              uVar28 = (uint)*(byte *)((long)T + lVar15 + -2);
            }
            if ((int)uVar27 < (int)uVar28) goto LAB_00111ea9;
          }
          lVar15 = (long)iVar5;
          iVar5 = iVar5 + -1;
          SA[lVar15 + -1] = uVar4;
        }
        uVar18 = (ulong)(iVar24 - 1);
      }
    }
    else {
      sVar1 = uVar36 * 4;
      local_58 = malloc(sVar1);
      if ((local_58 == (void *)0x0) || (local_48 = malloc(sVar1), local_48 == (void *)0x0)) {
LAB_00111f8d:
        exit(-1);
      }
      for (uVar6 = 0; uVar36 != uVar6; uVar6 = uVar6 + 1) {
        *(uint *)((long)local_48 + uVar6 * 4) = uVar27;
      }
      if (C == B) {
        getCounts(T,C,n,k,cs);
      }
      getBuckets(C,B,k,0);
      memcpy(local_58,B,sVar1);
      if (cs == 4) {
        local_40 = (ulong)*(int *)((long)T + uVar18 * 4);
        iVar20 = B[local_40];
        lVar15 = (long)iVar20;
        LCP[lVar15] = 0;
        uVar30 = *(uint *)((long)T + uVar11 * 4 + -8);
      }
      else {
        local_40 = (ulong)*(byte *)((long)T + uVar18);
        iVar20 = B[local_40];
        lVar15 = (long)iVar20;
        LCP[lVar15] = 0;
        uVar30 = (uint)*(byte *)((long)T + (uVar11 - 2));
      }
      uVar4 = -n;
      if ((int)local_40 <= (int)uVar30) {
        uVar4 = uVar27;
      }
      SA[lVar15] = uVar4;
      *LCP = 0;
      pvVar16 = malloc(sVar1);
      if (pvVar16 == (void *)0x0) goto LAB_00111f8d;
      iVar20 = iVar20 + 1;
      uVar30 = 0;
      for (uVar6 = 0; uVar36 != uVar6; uVar6 = uVar6 + 1) {
        *(uint *)((long)pvVar16 + uVar6 * 4) = uVar30;
        uVar30 = uVar30 + (0 < C[uVar6]);
      }
      uVar36 = (ulong)uVar30;
      local_38 = uVar36 * 4;
      pvVar22 = malloc(local_38);
      if (pvVar22 == (void *)0x0) goto LAB_00111f8d;
      for (uVar6 = 0; uVar36 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined4 *)((long)pvVar22 + uVar6 * 4) = 0xffffffff;
      }
      piVar9 = (int *)malloc((long)(int)(uVar30 * 2 + 0x80c) << 2);
      if (piVar9 == (int *)0x0) goto LAB_00111f8d;
      iVar5 = uVar30 * 2 + 0x808;
      piVar9[0] = -1;
      piVar9[1] = -1;
      iVar24 = 1;
      uVar6 = 0;
      while (sVar1 = local_38, uVar6 != uVar11) {
        uVar30 = SA[uVar6];
        lVar35 = (long)(int)uVar30;
        SA[uVar6] = ~uVar30;
        iVar17 = LCP[uVar6];
        lVar15 = (long)iVar24;
        uVar34 = (undefined4)uVar6;
        local_50 = uVar6;
        if (lVar35 < 1) {
          if (iVar17 == -1) {
            __assert_fail("lcp != -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x195,
                          "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                         );
          }
          if (-1 < iVar17) {
            lVar35 = (lVar15 << 0x20) + 0x200000000;
            iVar24 = iVar24 + 4;
            piVar7 = piVar9 + lVar15;
            do {
              lVar35 = lVar35 + -0x200000000;
              iVar24 = iVar24 + -2;
              iVar14 = *piVar7;
              piVar7 = piVar7 + -2;
            } while (iVar17 <= iVar14);
            *(undefined4 *)((long)piVar9 + (lVar35 >> 0x1e) + 4) = uVar34;
            piVar9[iVar24] = iVar17;
          }
        }
        else {
          if (iVar17 == -1) {
            if (cs == 4) {
              uVar4 = *(uint *)((long)T + lVar35 * 4);
            }
            else {
              uVar4 = (uint)*(byte *)((long)T + lVar35);
            }
            lVar21 = 0;
            do {
              if (cs == 4) {
                uVar28 = *(uint *)((long)T + lVar21 * 4 + lVar35 * 4);
                uVar23 = *(uint *)((long)T +
                                  (long)(*(int *)((long)local_48 + (long)(int)uVar4 * 4) +
                                        (int)lVar21) * 4);
              }
              else {
                uVar28 = (uint)*(byte *)((long)T + lVar21 + lVar35);
                uVar23 = (uint)*(byte *)((long)T +
                                        (long)(*(int *)((long)local_48 + (long)(int)uVar4 * 4) +
                                              (int)lVar21));
              }
              lVar21 = lVar21 + 1;
            } while (uVar28 == uVar23);
            iVar17 = (int)lVar21 + -1;
          }
          uVar4 = uVar30 - 1;
          if (cs == 4) {
            uVar28 = *(uint *)((long)T + (ulong)uVar4 * 4);
            if ((int)uVar28 < *(int *)((long)T + lVar35 * 4)) {
LAB_001120b7:
              __assert_fail("chr(j) >= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x17a,
                            "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                           );
            }
          }
          else {
            bVar2 = *(byte *)((long)T + (ulong)uVar4);
            uVar28 = (uint)bVar2;
            if (bVar2 < *(byte *)((long)T + lVar35)) goto LAB_001120b7;
          }
          lVar21 = (long)(int)uVar28;
          if (uVar28 != (uint)local_40) {
            B[(int)(uint)local_40] = iVar20;
            iVar20 = B[lVar21];
            local_40 = (ulong)uVar28;
          }
          lVar26 = (long)iVar20;
          if (lVar26 <= (long)uVar6) {
            __assert_fail("i < bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x17f,
                          "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                         );
          }
          *(uint *)((long)local_48 + lVar21 * 4) = uVar4;
          uVar23 = 0;
          if (uVar30 != 1) {
            if (cs == 4) {
              uVar31 = *(uint *)((long)T + lVar35 * 4 + -8);
            }
            else {
              uVar31 = (uint)*(byte *)((long)T + lVar35 + -2);
            }
            uVar23 = uVar4;
            if ((int)uVar31 < (int)uVar28) {
              uVar23 = -uVar30;
            }
          }
          SA[lVar26] = uVar23;
          if (iVar17 < 0) {
            __assert_fail("lcp >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x184,
                          "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                         );
          }
          lVar35 = (lVar15 << 0x20) + 0x200000000;
          lVar15 = lVar15 + 2;
          iVar14 = iVar24 + -1;
          iVar24 = iVar24 + 4;
          do {
            iVar32 = iVar14;
            iVar24 = iVar24 + -2;
            lVar29 = lVar15 + -2;
            lVar35 = lVar35 + -0x200000000;
            lVar3 = lVar15 + -2;
            lVar15 = lVar29;
            iVar14 = iVar32 + -2;
          } while (iVar17 <= piVar9[lVar3]);
          *(undefined4 *)((long)piVar9 + (lVar35 >> 0x1e) + 4) = uVar34;
          piVar9[iVar24] = iVar17;
          if (lVar29 < 1) {
            __assert_fail("stack_end-3 >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x18a,
                          "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                         );
          }
          lVar15 = (long)*(int *)((long)pvVar16 + lVar21 * 4);
          piVar7 = piVar9 + iVar32;
          do {
            piVar13 = piVar7;
            piVar7 = piVar13 + -2;
          } while (*(int *)((long)pvVar22 + lVar15 * 4) < *piVar13);
          iVar17 = 0;
          if (iVar20 != *(int *)((long)local_58 + lVar21 * 4)) {
            iVar17 = piVar13[3] + 1;
          }
          LCP[lVar26] = iVar17;
          *(undefined4 *)((long)pvVar22 + lVar15 * 4) = uVar34;
          iVar20 = iVar20 + 1;
        }
        if (iVar5 < iVar24) {
          pvVar10 = malloc(local_38);
          if (pvVar10 == (void *)0x0) goto LAB_00111f8d;
          memcpy(pvVar10,pvVar22,sVar1);
          qsort(pvVar10,uVar36,4,int_cmp);
          iVar17 = 1;
          lVar15 = 2;
          for (uVar6 = 0; uVar6 != uVar36; uVar6 = uVar6 + 1) {
            iVar14 = *(int *)((long)pvVar10 + uVar6 * 4);
            if (piVar9[(long)iVar17 + -1] <= iVar14) {
              lVar15 = (long)(int)lVar15;
              lVar35 = lVar15 << 0x20;
              while( true ) {
                if (iVar24 <= lVar15) {
                  if ((int)lVar15 <= iVar24) {
                    __assert_fail("l < stack_end",
                                  "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                                  ,0x1a8,
                                  "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                                 );
                  }
                  goto LAB_001118a4;
                }
                if (iVar14 < piVar9[lVar15]) break;
                lVar15 = lVar15 + 2;
                lVar35 = lVar35 + 0x200000000;
              }
              piVar9[(long)iVar17 + 1] = *(int *)((long)piVar9 + (lVar35 >> 0x1e));
              piVar9[(long)iVar17 + 2] = *(int *)((long)piVar9 + (lVar35 >> 0x1e) + 4);
              iVar17 = iVar17 + 2;
            }
          }
LAB_001118a4:
          free(pvVar10);
          iVar24 = iVar17;
        }
        uVar6 = local_50 + 1;
      }
      if (C == B) {
        getCounts(T,C,n,k,cs);
      }
      getBuckets(C,B,k,1);
      for (uVar11 = 0; uVar36 != uVar11; uVar11 = uVar11 + 1) {
        *(uint *)((long)pvVar22 + uVar11 * 4) = uVar27;
      }
      *piVar9 = n;
      piVar9[1] = -1;
      local_80 = *B;
      uVar27 = 0;
      local_d0 = 1;
      while( true ) {
        sVar1 = local_38;
        iVar20 = (int)uVar18;
        if (iVar20 < 0) break;
        iVar24 = LCP[uVar18];
        if ((iVar24 < 0 && iVar20 != 0) && (-1 < LCP[iVar20 - 1U])) {
          lVar15 = (long)(SA[uVar18] >> 0x1f ^ SA[uVar18]);
          lVar21 = (long)(SA[iVar20 - 1U] >> 0x1f ^ SA[iVar20 - 1U]);
          lVar35 = 0;
          do {
            if (cs == 4) {
              uVar30 = *(uint *)((long)T + lVar35 * 4 + lVar15 * 4);
              uVar4 = *(uint *)((long)T + lVar35 * 4 + lVar21 * 4);
            }
            else {
              uVar30 = (uint)*(byte *)((long)T + lVar35 + lVar15);
              uVar4 = (uint)*(byte *)((long)T + lVar35 + lVar21);
            }
            lVar35 = lVar35 + 1;
          } while (uVar30 == uVar4);
          iVar24 = (int)lVar35 + -1;
          LCP[uVar18] = iVar24;
        }
        uVar30 = SA[uVar18];
        lVar15 = (long)(int)uVar30;
        iVar17 = (int)local_d0;
        if (lVar15 < 1) {
          SA[uVar18] = ~uVar30;
        }
        else {
          uVar4 = uVar30 - 1;
          if (cs == 4) {
            uVar28 = *(uint *)((long)T + (ulong)uVar4 * 4);
            if (*(int *)((long)T + lVar15 * 4) < (int)uVar28) {
LAB_00112133:
              __assert_fail("chr(j) <= chr(j + 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                            ,0x1c6,
                            "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                           );
            }
          }
          else {
            bVar2 = *(byte *)((long)T + (ulong)uVar4);
            uVar28 = (uint)bVar2;
            if (*(byte *)((long)T + lVar15) < bVar2) goto LAB_00112133;
          }
          if (uVar28 != uVar27) {
            B[(int)uVar27] = local_80;
            local_80 = B[(int)uVar28];
            uVar27 = uVar28;
          }
          if (iVar20 < local_80) {
            __assert_fail("bb <= i",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x1ca,
                          "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                         );
          }
          if (uVar4 == 0) {
LAB_00111a8e:
            uVar4 = -uVar30;
          }
          else {
            if (cs == 4) {
              uVar23 = *(uint *)((long)T + lVar15 * 4 + -8);
            }
            else {
              uVar23 = (uint)*(byte *)((long)T + lVar15 + -2);
            }
            if ((int)uVar28 < (int)uVar23) goto LAB_00111a8e;
          }
          SA[(long)local_80 + -1] = uVar4;
          if (k <= (int)(uVar28 + 1)) {
            __assert_fail("c0+1<k",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x1cc,
                          "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                         );
          }
          if (iVar17 < 1) {
            __assert_fail("stack_end-1 >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x1d0,
                          "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                         );
          }
          lVar15 = (long)*(int *)((long)pvVar16 + (long)(int)uVar28 * 4);
          piVar7 = piVar9 + (iVar17 - 1);
          do {
            piVar13 = piVar7;
            piVar7 = piVar13 + -2;
          } while (*piVar13 <= *(int *)((long)pvVar22 + lVar15 * 4));
          iVar14 = 0;
          if (local_80 != *(int *)((long)local_58 + (long)(int)(uVar28 + 1) * 4)) {
            iVar14 = piVar13[3] + 1;
          }
          LCP[local_80] = iVar14;
          if (local_80 == iVar20) {
            iVar24 = LCP[uVar18];
          }
          *(int *)((long)pvVar22 + lVar15 * 4) = iVar20;
          local_80 = local_80 + -1;
        }
        if (iVar24 < 0) {
          __assert_fail("lcp >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                        ,0x1db,
                        "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                       );
        }
        lVar35 = ((long)iVar17 << 0x20) + 0x200000000;
        uVar30 = iVar17 + 4;
        lVar15 = (long)iVar17;
        do {
          lVar35 = lVar35 + -0x200000000;
          uVar30 = uVar30 - 2;
          if (lVar15 < 0) break;
          piVar7 = piVar9 + lVar15;
          lVar15 = lVar15 + -2;
        } while (iVar24 <= *piVar7);
        *(int *)((long)piVar9 + (lVar35 >> 0x1e) + 4) = iVar20;
        piVar9[(int)uVar30] = iVar24;
        if (iVar5 < (int)uVar30) {
          pvVar10 = malloc(local_38);
          if (pvVar10 != (void *)0x0) {
            memcpy(pvVar10,pvVar22,sVar1);
            qsort(pvVar10,uVar36,4,int_cmp);
            lVar15 = 2;
            uVar11 = uVar36;
            local_d0 = 1;
            do {
              do {
                if ((long)uVar11 < 1) goto LAB_00111c5a;
                iVar24 = *(int *)((long)pvVar10 + uVar11 * 4 + -4);
                uVar11 = uVar11 - 1;
              } while (piVar9[local_d0 - 1] <= iVar24);
              lVar35 = lVar15 << 0x20;
              lVar15 = (long)(int)lVar15;
LAB_00111c18:
              if ((int)uVar30 <= lVar15) {
                if ((int)lVar15 <= (int)uVar30) {
                  __assert_fail("l < stack_end",
                                "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                                ,0x1ec,
                                "void induceSAandLCP(const void *, int *, int *, int *, int *, int, int, int)"
                               );
                }
LAB_00111c5a:
                free(pvVar10);
                goto LAB_00111c7b;
              }
              if (iVar24 < piVar9[lVar15]) goto code_r0x00111c23;
              piVar9[local_d0 + 1] = *(int *)((long)piVar9 + (lVar35 >> 0x1e));
              piVar9[local_d0 + 2] = *(int *)((long)piVar9 + (lVar35 >> 0x1e) + 4);
              local_d0 = (ulong)((int)local_d0 + 2);
            } while( true );
          }
          goto LAB_00111f8d;
        }
        local_d0 = (ulong)uVar30;
LAB_00111c7b:
        uVar18 = (ulong)(iVar20 - 1);
      }
      free(local_58);
      free(pvVar22);
      free(piVar9);
      free(pvVar16);
      free(local_48);
      iVar20 = 0;
    }
  }
  else {
    if (C == B) {
      getCounts(T,C,n,k,cs);
    }
    getBuckets(C,B,k,0);
    uVar30 = uVar27;
    if (cs == 4) {
      uVar36 = (ulong)*(int *)((long)T + uVar18 * 4);
      puVar8 = (uint *)(SA + B[uVar36]);
      if (1 < n) {
        uVar4 = *(uint *)((long)T + uVar11 * 4 + -8);
LAB_00111156:
        uVar30 = -n;
        if ((int)uVar36 <= (int)uVar4) {
          uVar30 = uVar27;
        }
      }
    }
    else {
      uVar36 = (ulong)*(byte *)((long)T + uVar18);
      puVar8 = (uint *)(SA + B[uVar36]);
      if (1 < n) {
        uVar4 = (uint)*(byte *)((long)T + (uVar11 - 2));
        goto LAB_00111156;
      }
    }
    *puVar8 = uVar30;
    puVar8 = puVar8 + 1;
    for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
      uVar27 = SA[uVar6];
      lVar15 = (long)(int)uVar27;
      uVar30 = (uint)uVar36;
      if (lVar15 < 1) {
        if (uVar27 != 0) {
          SA[uVar6] = ~uVar27;
        }
      }
      else {
        uVar4 = uVar27 - 1;
        if (cs == 4) {
          uVar28 = *(uint *)((long)T + (ulong)uVar4 * 4);
          if ((int)uVar28 < *(int *)((long)T + lVar15 * 4)) {
LAB_00111f30:
            __assert_fail("chr(j) >= chr(j + 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x20d,"int computeBWT(const void *, int *, int *, int *, int, int, int)")
            ;
          }
        }
        else {
          bVar2 = *(byte *)((long)T + (ulong)uVar4);
          uVar28 = (uint)bVar2;
          if (bVar2 < *(byte *)((long)T + lVar15)) goto LAB_00111f30;
        }
        SA[uVar6] = ~uVar28;
        if (uVar28 != uVar30) {
          B[(int)uVar30] = (int)((ulong)((long)puVar8 - (long)SA) >> 2);
          puVar8 = (uint *)(SA + B[(int)uVar28]);
          uVar30 = uVar28;
        }
        if ((long)puVar8 - (long)SA >> 2 <= (long)uVar6) {
          __assert_fail("i < (b - SA)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                        ,0x210,"int computeBWT(const void *, int *, int *, int *, int, int, int)");
        }
        uVar28 = 0;
        if (uVar27 != 1) {
          if (cs == 4) {
            uVar23 = *(uint *)((long)T + lVar15 * 4 + -8);
          }
          else {
            uVar23 = (uint)*(byte *)((long)T + lVar15 + -2);
          }
          uVar28 = -uVar27;
          if ((int)uVar30 <= (int)uVar23) {
            uVar28 = uVar4;
          }
        }
        *puVar8 = uVar28;
        puVar8 = puVar8 + 1;
      }
      uVar36 = (ulong)uVar30;
    }
    if (C == B) {
      getCounts(T,C,n,k,cs);
    }
    getBuckets(C,B,k,1);
    piVar9 = SA + *B;
    uVar27 = 0;
    uVar36 = 0xffffffffffffffff;
    while( true ) {
      iVar20 = (int)uVar36;
      if ((int)uVar18 < 0) break;
      uVar30 = SA[uVar18];
      lVar15 = (long)(int)uVar30;
      if (lVar15 < 1) {
        uVar11 = uVar18;
        if (uVar30 != 0) {
          SA[uVar18] = ~uVar30;
          uVar11 = uVar36;
        }
      }
      else {
        uVar4 = uVar30 - 1;
        if (cs == 4) {
          uVar28 = *(uint *)((long)T + (ulong)uVar4 * 4);
          if (*(int *)((long)T + lVar15 * 4) < (int)uVar28) {
LAB_00111f6e:
            __assert_fail("chr(j) <= chr(j + 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                          ,0x21c,"int computeBWT(const void *, int *, int *, int *, int, int, int)")
            ;
          }
        }
        else {
          bVar2 = *(byte *)((long)T + (ulong)uVar4);
          uVar28 = (uint)bVar2;
          if (*(byte *)((long)T + lVar15) < bVar2) goto LAB_00111f6e;
        }
        SA[uVar18] = uVar28;
        if (uVar28 != uVar27) {
          B[(int)uVar27] = (int)((ulong)((long)piVar9 - (long)SA) >> 2);
          piVar9 = SA + B[(int)uVar28];
          uVar27 = uVar28;
        }
        if ((long)uVar18 < (long)piVar9 - (long)SA >> 2) {
          __assert_fail("(b - SA) <= i",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                        ,0x21f,"int computeBWT(const void *, int *, int *, int *, int, int, int)");
        }
        uVar28 = 0;
        if (uVar30 != 1) {
          if (cs == 4) {
            uVar30 = *(uint *)((long)T + lVar15 * 4 + -8);
          }
          else {
            uVar30 = (uint)*(byte *)((long)T + lVar15 + -2);
          }
          uVar28 = uVar4;
          if ((int)uVar27 < (int)uVar30) {
            uVar28 = ~uVar30;
          }
        }
        piVar9[-1] = uVar28;
        piVar9 = piVar9 + -1;
        uVar11 = uVar36;
      }
      uVar18 = (ulong)((int)uVar18 - 1);
      uVar36 = uVar11;
    }
  }
  if ((bVar19 & 5) != 0) {
    free(C);
  }
joined_r0x00110b9b:
  if ((bVar19 & 2) != 0) {
    free(B);
  }
  return iVar20;
code_r0x00110fe1:
  iVar20 = SA[uVar12 - 1 & 0xffffffff];
  if (cs == 4) {
    uVar30 = *(uint *)((long)T + (long)iVar20 * 4);
  }
  else {
    uVar30 = (uint)*(byte *)((long)T + (long)iVar20);
  }
  uVar4 = uVar4 - 1;
  piVar9 = piVar9 + -1;
  uVar6 = (ulong)((int)uVar6 - 1);
  uVar12 = uVar12 - 1;
  if (uVar30 != uVar23) goto LAB_00110f9b;
  goto LAB_00110fda;
code_r0x00110f23:
  uVar25 = uVar12 - 1 & 0xffffffff;
  iVar20 = SA[uVar25];
  if (cs == 4) {
    uVar28 = *(uint *)((long)T + (long)iVar20 * 4);
  }
  else {
    uVar28 = (uint)*(byte *)((long)T + (long)iVar20);
  }
  iVar5 = LCP[uVar25];
  uVar4 = uVar4 - 1;
  uVar6 = (ulong)((int)uVar6 - 1);
  lVar21 = lVar15 + -1;
  uVar12 = uVar12 - 1;
  if (uVar28 != uVar30) goto code_r0x00110f57;
  goto LAB_00110f16;
code_r0x00110f57:
  LCP[lVar15] = -1;
  uVar30 = uVar28;
  goto LAB_00110ed8;
code_r0x00111c23:
  lVar15 = lVar15 + 2;
  lVar35 = lVar35 + 0x200000000;
  goto LAB_00111c18;
}

Assistant:

static sais_index_type sais_main(const void *T, sais_index_type *SA,
				 sais_index_type *LCP,
				 sais_index_type fs, sais_index_type n, sais_index_type k, int cs,
				 sais_bool_type isbwt,
				 sais_bool_type level0) { /* level0 = 1 iff recursion depth is 0 */
  sais_index_type *C, *B, *D, *RA, *PLCP, *PHI, *DELTA, *b;
  sais_index_type i, j, m, /* m: number of S*-suffixes */
    p, q, t, name, pidx = 0, newfs;
  sais_index_type c0, c1;
  unsigned int flags;

  assert((T != NULL) && (SA != NULL));
  assert((0 <= fs) && (0 < n) && (1 <= k));

  if(k <= MINBUCKETSIZE) {
    if((C = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
    if(k <= fs) {
      B = SA + (n + fs - k);
      flags = 1;
    } else {
      if((B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { SAIS_MYFREE(C, k, sais_index_type); return -2; }
      flags = 3;
    }
  } else if(k <= fs) {
    C = SA + (n + fs - k);
    if(k <= (fs - k)) {
      B = C - k;
      flags = 0;
    } else if(k <= (MINBUCKETSIZE * 4)) {
      if((B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
      flags = 2;
    } else {
      B = C;
      flags = 8;
    }
  } else {
    if((C = B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
    flags = 4 | 8;
  }
  if((n <= SAIS_LMSSORT2_LIMIT) && (2 <= (n / k))) {
    if(flags & 1) { flags |= ((k * 2) <= (fs - k)) ? 32 : 16; }
    else if((flags == 0) && ((k * 2) <= (fs - k * 2))) { flags |= 32; }
  }

  /* stage 1: reduce the problem by at least 1/2
     sort all the LMS-substrings */
  getCounts(T, C, n, k, cs); getBuckets(C, B, k, 1); /* find ends of buckets */

  for(i = 0; i < n; ++i) { SA[i] = 0; }
  b = &t; i = n - 1; j = n; m = 0; c0 = chr(n - 1);
  do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
  for(; 0 <= i;) {
    do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) <= c1));
    if(0 <= i) {
      *b = j;
      b = SA + --B[c1]; j = i; ++m;
      do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
    }
  }

  if(1 < m) {
    if(flags & (16 | 32)) {
      if(flags & 16) {
        if((D = SAIS_MYMALLOC(k * 2, sais_index_type)) == NULL) {
          if(flags & (1 | 4)) { SAIS_MYFREE(C, k, sais_index_type); }
          if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }
          return -2;
        }
      } else {
        D = B - k * 2;
      }
      assert((j + 1) < n);
      ++B[chr(j + 1)];
      for(i = 0, j = 0; i < k; ++i) {
        j += C[i];
        if(B[i] != j) { assert(SA[B[i]] != 0); SA[B[i]] += n; }
        D[i] = D[i + k] = 0;
      }
      LMSsort2(T, SA, C, B, D, n, k, cs);
      name = LMSpostproc2(SA, n, m);
      if(flags & 16) { SAIS_MYFREE(D, k * 2, sais_index_type); }
    } else {
      LMSsort1(T, SA, C, B, n, k, cs);
      name = LMSpostproc1(T, SA, n, m, cs);
    }
  } else if (m == 1) { /* only one S*-suffix => set immediately */
    *b = j + 1;        /* set entry in SA */
    if (level0) { LCP[b-SA] = -1; } /* mark first (=only) S*-suffix in bucket */
    name = 1;
  } else {
    name = 0;
  }

  /* stage 2: solve the reduced problem
     recurse if names are not yet unique */
  if(name < m) {
    if(flags & 4) { SAIS_MYFREE(C, k, sais_index_type); }
    if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }
    newfs = (n + fs) - (m * 2);
    if((flags & (1 | 4 | 8)) == 0) {
      if((k + name) <= newfs) { newfs -= k; }
      else { flags |= 8; }
    }
    assert((n >> 1) <= (newfs + m));
    RA = SA + m + newfs;
    for(i = m + (n >> 1) - 1, j = m - 1; m <= i; --i) {
      if(SA[i] != 0) {
        RA[j--] = SA[i] - 1;
      }
    }
    
    if(sais_main(RA, SA, NULL, newfs, m, name, sizeof(sais_index_type), 0, 0) != 0) {
      if(flags & 1) { SAIS_MYFREE(C, k, sais_index_type); }
      return -2;
    }

    /* (re)compute starting positions of S*-suffixes (stored in RA): */
    i = n - 1; j = m - 1; c0 = chr(n - 1);
    do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
    for(; 0 <= i;) {
      do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) <= c1));
      if(0 <= i) {
        RA[j--] = i + 1;
        do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
      }
    }

    /* construct LCP for S*-suffixes: */
    /* PHI: "to whom I want to be compared" (pos. in T) */
    /* DELTA: "distance (in T) to next S*" (in PHI-order) */
    if (level0) {
      if (m < n/3) { /* hence we can store PHI and DELTA interleaved */
	PHI = LCP+m;       /* use space in LCP-array for PHI and DELTA */
	RA[m] = n;         /* stopper */
	j = SA[0];         /* j stores SA[i-1] in the following loop */
	PHI[j<<1] = n-1;   /* set PHI[SA[0]] to $ (causes mismatch in char. comp.) */
	PHI[(j<<1)+1] = 0; /* set DELTA */
	for (i = 1; i < m; ++i) {
	  q = SA[i];                /* text position */
	  p = q<<1;                 /* for interleaving */
	  PHI[p]=RA[j];             /* set PHI-array */
	  PHI[p+1]=RA[j+1]-RA[j];   /* set DELTA */
	  j = q;                    /* store for next loop iteration */
	}

	PLCP = PHI; /* overwrite DELTA in following loop */
	p = 0; /* guaranteed LCP-value */
	j = 0; /* position in PLCP and RA */
	for (i = 0; i < n; ++i) {
	  if (i == RA[j]) {
	    sais_index_type twoj = j << 1;
	    if (p < 0) p = 0;
	    while (chr(i+p) == chr(PHI[twoj]+p)) ++p;
	    t = PHI[twoj+1];      /* accesses DELTA-value */
	    q = RA[j+1]-RA[j];    /* length difference */
	    PLCP[twoj] = p;       /* overwrite PHI with PLCP */
	    ++j;
	    p -= (t > q) ? t : q; /* decrease p by larger of t and q */
	  }
	}

	/* translate PLCP-values to SA-order: */
	for (j = 0; j < m; ++j) LCP[j] = PLCP[SA[j]<<1];
      }
      else { /* non-interleaved */
	PHI = LCP;     /* use space in LCP-array for PHI */
	DELTA = LCP+m; /* because we compute only m < n/2 values, this is valid */
	RA[m] = n;     /* stopper */
	j = SA[0];     /* j stores SA[i-1] in the following loop */
	PHI[j] = n-1;  /* set PHI[SA[0]] to $ (causes mismatch in char. comp.) */
	DELTA[j] = 0;
	for (i = 1; i < m; ++i) {
	  q = SA[i];              /* text position */
	  PHI[q]=RA[j];           /* set PHI-array */
	  DELTA[q]=RA[j+1]-RA[j]; /* set DELTA */
	  j = q;                  /* store for next loop iteration */
	}

	PLCP = DELTA; /* overwrite DELTA in following loop */
	p = 0; /* guaranteed LCP-value */
	j = 0; /* position in PLCP and RA */
	for (i = 0; i < n; ++i) {
	  if (i == RA[j]) {
	    if (p < 0) p = 0;
	    while (chr(i+p) == chr(PHI[j]+p)) ++p;
	    t = PLCP[j];          /* accesses DELTA-value */
	    q = RA[j+1]-RA[j];    /* length difference */
	    PLCP[j++] = p;
	    p -= (t > q) ? t : q; /* decrease p by larger of t and q */
	  }
	}

	/* translate PLCP-values to SA-order: */
	for (j = 0; j < m; ++j) LCP[j] = PLCP[SA[j]];
      }
    }

    /* translate indices in RA to indices in T: */
    for(i = 0; i < m; ++i) SA[i] = RA[SA[i]];

    if(flags & 4) {
      if((C = B = SAIS_MYMALLOC(k, int)) == NULL) { return -2; }
    }
    if(flags & 2) {
      if((B = SAIS_MYMALLOC(k, int)) == NULL) {
        if(flags & 1) { SAIS_MYFREE(C, k, sais_index_type); }
        return -2;
      }
    }
  } /* endif (name < m) */
  else if (level0) { /* this should only occur for small or pathetic inputs */
    /* all names unique => computing LCP for *S naively takes linear time */
    /*printf("*** computing LCP naively..."); */
    j = SA[0]; /* j = SA[i-1] in the following loop */
    for (i = 1; i < m; ++i) {
      p = 0;
      while (chr(SA[i]+p) == chr(j+p)) p++;
      LCP[i] = p;
      j = SA[i];
    }
    /*printf("done.\n"); */
  }

  /* stage 3: induce the result for the original problem */
  if(flags & 8) { getCounts(T, C, n, k, cs); }
  /* put all S*-suffixes (and their LCP-values) into their buckets */
  if(1 < m) { /* otherwise SA (and LCP) is already correct */
    getBuckets(C, B, k, 1); /* find ends of buckets */
    i = m - 1, j = n, p = SA[m - 1], c1 = chr(p);
    if (level0) {
      newfs = LCP[m-1]; /* newfs stores LCP[i] in the following loop */
      do {
	q = B[c0 = c1];
	while(q < j) {
	  SA[--j] = 0; LCP[j] = -2; /* set remaining entries in old bucket to 0/-2 */
	}
	
	do { /* step through bucket c0 and write S*-suffixes to SA: */
	  SA[--j] = p; LCP[j] = newfs;
	  if(--i < 0) break;
	  newfs = LCP[i]; p = SA[i];
	} while((c1 = chr(p)) == c0);
	/*assert(LCP[j]==0); *//* first S*-suffix in bucket must have LCP-value 0 */
	LCP[j] = -1;       /* mark first S*-suffix in every bucket */
      } while(0 <= i);
      while(0 < j) {
	SA[--j] = 0; LCP[j] = -2; /* set remaining entries in smallest buckets to 0/-2 */
      }
    }
    else {
      do {
	q = B[c0 = c1];
	while(q < j) SA[--j] = 0; /* set remaining entries in old bucket to 0 */
	do { /* step through bucket c0 */
	  SA[--j] = p;
	  if(--i < 0) break;
	  p = SA[i];
	} while((c1 = chr(p)) == c0);
      } while(0 <= i);
      while(0 < j) SA[--j] = 0; /* set remaining entries in 1st bucket to 0 */
    }
  }

  if(isbwt == 0) {
    if (level0) induceSAandLCP(T, SA, LCP, C, B, n, k, cs);
    else induceSA(T, SA, C, B, n, k, cs);
  }
  else { pidx = computeBWT(T, SA, C, B, n, k, cs); }
  if(flags & (1 | 4)) { SAIS_MYFREE(C, k, sais_index_type); }
  if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }

  return pidx;
}